

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O1

activationType PyreNet::ActivationFactory::fromString(string *activation)

{
  int iVar1;
  activationType aVar2;
  undefined8 *puVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)activation);
  if (iVar1 == 0) {
    aVar2 = step;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)activation);
    if (iVar1 == 0) {
      aVar2 = linear;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)activation);
      if (iVar1 == 0) {
        aVar2 = tanh;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)activation);
        if (iVar1 == 0) {
          aVar2 = sigmoid;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)activation);
          aVar2 = relu;
          if (iVar1 != 0) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = std::operator>>;
            __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
          }
        }
      }
    }
  }
  return aVar2;
}

Assistant:

LayerDefinition::activationType ActivationFactory::fromString(const std::string& activation) {
        if (activation == "step") {
            return LayerDefinition::step;
        } else if (activation == "linear") {
            return LayerDefinition::linear;
        } else if (activation == "tanh") {
            return LayerDefinition::tanh;
        } else if (activation == "sigmoid") {
            return LayerDefinition::sigmoid;
        } else if (activation == "relu") {
            return LayerDefinition::relu;
        } else {
            throw std::exception();
        }
    }